

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O3

QRect __thiscall QTabBarPrivate::normalizedScrollRect(QTabBarPrivate *this,int index)

{
  QWidget *this_00;
  QWidgetData *pQVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  ulong uVar5;
  LayoutDirection LVar6;
  uint uVar7;
  QStyle *pQVar8;
  int iVar9;
  Representation RVar10;
  ulong uVar11;
  Representation RVar12;
  int iVar13;
  Tab **ppTVar14;
  int iVar15;
  Representation RVar16;
  Representation RVar17;
  Representation RVar18;
  uint uVar19;
  long in_FS_OFFSET;
  bool bVar20;
  QRect QVar21;
  QRect QVar22;
  QRect QVar23;
  QRect QVar24;
  QRect local_128;
  QRect local_118;
  QRect local_108;
  QRect local_f8;
  QRect local_e8;
  QStyleOptionTab local_d8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  if ((((this->leftB->super_QAbstractButton).super_QWidget.data)->widget_attributes & 0x10000) == 0)
  {
    memset(&local_d8,0xaa,0xa0);
    QStyleOptionTab::QStyleOptionTab(&local_d8);
    (**(code **)(*(long *)this_00 + 0x1c8))(this_00,&local_d8,this->currentIndex);
    pQVar1 = this_00->data;
    local_d8.super_QStyleOption.rect.x2.m_i = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
    local_d8.super_QStyleOption.rect.y2.m_i = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
    local_d8.super_QStyleOption.rect.x1.m_i = 0;
    local_d8.super_QStyleOption.rect.y1.m_i = 0;
    pQVar8 = QWidget::style(this_00);
    QVar21 = (QRect)(**(code **)(*(long *)pQVar8 + 0xc0))(pQVar8,0x35,&local_d8,this_00);
    local_e8 = QVar21;
    pQVar8 = QWidget::style(this_00);
    QVar22 = (QRect)(**(code **)(*(long *)pQVar8 + 0xc0))(pQVar8,0x36,&local_d8,this_00);
    uVar11 = QVar22._0_8_;
    local_f8 = QVar22;
    pQVar8 = QWidget::style(this_00);
    QVar23 = (QRect)(**(code **)(*(long *)pQVar8 + 0xc0))(pQVar8,0x18,&local_d8,this_00);
    local_108 = QVar23;
    pQVar8 = QWidget::style(this_00);
    QVar24 = (QRect)(**(code **)(*(long *)pQVar8 + 0xc0))(pQVar8,0x37,&local_d8,this_00);
    RVar16 = QVar24.y1.m_i;
    RVar17 = QVar24.y2.m_i;
    local_118 = QVar24;
    if ((this->shape - RoundedWest & 0xfffffffa) == 0) {
      iVar9 = (this_00->data->crect).y2.m_i - (this_00->data->crect).y1.m_i;
      RVar12.m_i = iVar9 + 1;
      iVar15 = (iVar9 - (RVar12.m_i >> 0x1f)) + 1 >> 1;
      RVar18 = QVar21.y1.m_i;
      RVar10 = QVar22.y1.m_i;
      if ((RVar18.m_i < iVar15) && (RVar10.m_i < iVar15)) {
        uVar19 = QVar22.y2.m_i.m_i + 1;
      }
      else {
        uVar5 = QVar21._0_8_;
        if (RVar18.m_i < iVar15 || RVar10.m_i < iVar15) {
          uVar5 = uVar11;
        }
        RVar12.m_i = (int)(uVar5 >> 0x20);
        uVar19 = 0;
        if (RVar18.m_i < iVar15 || RVar10.m_i < iVar15) {
          uVar19 = QVar21.y2.m_i.m_i + 1;
        }
      }
      lVar2 = (this->tabList).d.size;
      if (lVar2 + -1 == (long)index) {
        bVar20 = false;
      }
      else {
        bVar20 = RVar12.m_i !=
                 (((this->tabList).d.ptr[lVar2 + -1]->rect).y2.m_i - this->scrollOffset) + 1;
      }
      uVar7 = uVar19;
      if ((uVar19 + this->scrollOffset != 0 && index != 0) &&
         (uVar7 = QVar23.y2.m_i.m_i + 1,
         QVar23.y1.m_i.m_i + -1 == QVar23.y2.m_i.m_i && QVar23.x1.m_i.m_i + -1 == QVar23.x2.m_i.m_i)
         ) {
        uVar7 = uVar19;
      }
      if ((bVar20) && (RVar16.m_i + -1 != RVar17.m_i || QVar24.x1.m_i.m_i + -1 != QVar24.x2.m_i.m_i)
         ) {
        RVar12.m_i = RVar16.m_i;
      }
    }
    else {
      RVar12 = QVar21.x1.m_i;
      LVar6 = QWidget::layoutDirection(this_00);
      if (LVar6 == RightToLeft) {
        pQVar1 = this_00->data;
        local_128.x2.m_i = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
        local_128.y2.m_i = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
        local_128.x1.m_i = 0;
        local_128.y1.m_i = 0;
        local_e8 = QStyle::visualRect(RightToLeft,&local_128,&local_e8);
        pQVar1 = this_00->data;
        local_128.x2.m_i = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
        local_128.y2.m_i = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
        local_128.x1.m_i = 0;
        local_128.y1.m_i = 0;
        local_f8 = QStyle::visualRect(RightToLeft,&local_128,&local_f8);
        pQVar1 = this_00->data;
        local_128.x2.m_i = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
        local_128.y2.m_i = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
        local_128.x1.m_i = 0;
        local_128.y1.m_i = 0;
        local_108 = QStyle::visualRect(RightToLeft,&local_128,&local_108);
        pQVar1 = this_00->data;
        local_128.x2.m_i = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
        local_128.y2.m_i = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
        local_128.x1.m_i = 0;
        local_128.y1.m_i = 0;
        local_118 = QStyle::visualRect(RightToLeft,&local_128,&local_118);
        auVar4 = local_118._0_12_;
        uVar11 = (ulong)(uint)local_f8.x1.m_i;
        RVar16 = local_118.y1.m_i;
        RVar17 = local_118.y2.m_i;
        RVar12.m_i = local_e8.x1.m_i;
      }
      else {
        auVar4 = QVar24._0_12_;
      }
      pQVar1 = this_00->data;
      iVar15 = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
      iVar9 = iVar15 + 1;
      iVar13 = (iVar15 - (iVar9 >> 0x1f)) + 1 >> 1;
      iVar15 = (int)uVar11;
      if ((RVar12.m_i < iVar13) && (iVar15 < iVar13)) {
        uVar19 = local_f8.x2.m_i + 1;
        RVar12.m_i = iVar9;
      }
      else if ((RVar12.m_i < iVar13) || (uVar19 = 0, iVar15 < iVar13)) {
        uVar19 = local_e8.x2.m_i + 1;
        RVar12.m_i = iVar15;
      }
      ppTVar14 = (Tab **)(long)index;
      lVar2 = (this->tabList).d.size;
      if ((Tab **)(lVar2 + -1) == ppTVar14) {
        bVar20 = false;
      }
      else {
        ppTVar14 = (this->tabList).d.ptr;
        bVar20 = RVar12.m_i != ((ppTVar14[lVar2 + -1]->rect).x2.m_i - this->scrollOffset) + 1;
      }
      uVar7 = uVar19;
      if (uVar19 + this->scrollOffset != 0 && index != 0) {
        iVar9 = -(uint)(local_108.x1.m_i.m_i + -1 == local_108.x2.m_i.m_i);
        iVar15 = -(uint)(local_108.y1.m_i.m_i + -1 == local_108.y2.m_i.m_i);
        auVar3._4_4_ = iVar9;
        auVar3._0_4_ = iVar9;
        auVar3._8_4_ = iVar15;
        auVar3._12_4_ = iVar15;
        iVar9 = movmskpd((int)ppTVar14,auVar3);
        uVar7 = local_108.x2.m_i.m_i + 1;
        if (iVar9 == 3) {
          uVar7 = uVar19;
        }
      }
      if ((bVar20) && (RVar17.m_i != RVar16.m_i + -1 || auVar4._8_4_ != auVar4._0_4_ + -1)) {
        RVar12.m_i = auVar4._0_4_;
      }
      iVar9 = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
    }
    QIcon::~QIcon(&local_d8.icon);
    if (&(local_d8.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_d8.text.d.d)->super_QArrayData,2,0x10);
      }
    }
    iVar15 = RVar12.m_i + -1;
    QStyleOption::~QStyleOption(&local_d8.super_QStyleOption);
  }
  else {
    pQVar1 = this_00->data;
    iVar15 = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
    iVar13 = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
    iVar9 = iVar13;
    if ((this->shape - RoundedWest & 0xfffffffa) == 0) {
      iVar9 = iVar15;
      iVar15 = iVar13;
    }
    uVar7 = 0;
  }
  QVar21.y1.m_i = 0;
  QVar21.x1.m_i = uVar7;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar21.y2.m_i = iVar9;
    QVar21.x2.m_i = iVar15;
    return QVar21;
  }
  __stack_chk_fail();
}

Assistant:

QRect QTabBarPrivate::normalizedScrollRect(int index)
{
    // "Normalized scroll rect" means return the free space on the tab bar
    // that doesn't overlap with scroll buttons or tear indicators, and
    // always return the rect as horizontal Qt::LeftToRight, even if the
    // tab bar itself is in a different orientation.

    Q_Q(QTabBar);
    // If scrollbuttons are not visible, then there's no tear either, and
    // the entire widget is the scroll rect.
    if (leftB->isHidden())
        return verticalTabs(shape) ? q->rect().transposed() : q->rect();

    QStyleOptionTab opt;
    q->initStyleOption(&opt, currentIndex);
    opt.rect = q->rect();

    QRect scrollButtonLeftRect = q->style()->subElementRect(QStyle::SE_TabBarScrollLeftButton, &opt, q);
    QRect scrollButtonRightRect = q->style()->subElementRect(QStyle::SE_TabBarScrollRightButton, &opt, q);
    QRect tearLeftRect = q->style()->subElementRect(QStyle::SE_TabBarTearIndicatorLeft, &opt, q);
    QRect tearRightRect = q->style()->subElementRect(QStyle::SE_TabBarTearIndicatorRight, &opt, q);

    if (verticalTabs(shape)) {
        int topEdge, bottomEdge;
        bool leftButtonIsOnTop = scrollButtonLeftRect.y() < q->height() / 2;
        bool rightButtonIsOnTop = scrollButtonRightRect.y() < q->height() / 2;

        if (leftButtonIsOnTop && rightButtonIsOnTop) {
            topEdge = scrollButtonRightRect.bottom() + 1;
            bottomEdge = q->height();
        } else if (!leftButtonIsOnTop && !rightButtonIsOnTop) {
            topEdge = 0;
            bottomEdge = scrollButtonLeftRect.top();
        } else {
            topEdge = scrollButtonLeftRect.bottom() + 1;
            bottomEdge = scrollButtonRightRect.top();
        }

        bool tearTopVisible = index != 0 && topEdge != -scrollOffset;
        bool tearBottomVisible = index != tabList.size() - 1 && bottomEdge != tabList.constLast()->rect.bottom() + 1 - scrollOffset;
        if (tearTopVisible && !tearLeftRect.isNull())
            topEdge = tearLeftRect.bottom() + 1;
        if (tearBottomVisible && !tearRightRect.isNull())
            bottomEdge = tearRightRect.top();

        return QRect(topEdge, 0, bottomEdge - topEdge, q->height());
    } else {
        if (q->layoutDirection() == Qt::RightToLeft) {
            scrollButtonLeftRect = QStyle::visualRect(Qt::RightToLeft, q->rect(), scrollButtonLeftRect);
            scrollButtonRightRect = QStyle::visualRect(Qt::RightToLeft, q->rect(), scrollButtonRightRect);
            tearLeftRect = QStyle::visualRect(Qt::RightToLeft, q->rect(), tearLeftRect);
            tearRightRect = QStyle::visualRect(Qt::RightToLeft, q->rect(), tearRightRect);
        }

        int leftEdge, rightEdge;
        bool leftButtonIsOnLeftSide = scrollButtonLeftRect.x() < q->width() / 2;
        bool rightButtonIsOnLeftSide = scrollButtonRightRect.x() < q->width() / 2;

        if (leftButtonIsOnLeftSide && rightButtonIsOnLeftSide) {
            leftEdge = scrollButtonRightRect.right() + 1;
            rightEdge = q->width();
        } else if (!leftButtonIsOnLeftSide && !rightButtonIsOnLeftSide) {
            leftEdge = 0;
            rightEdge = scrollButtonLeftRect.left();
        } else {
            leftEdge = scrollButtonLeftRect.right() + 1;
            rightEdge = scrollButtonRightRect.left();
        }

        bool tearLeftVisible = index != 0 && leftEdge != -scrollOffset;
        bool tearRightVisible = index != tabList.size() - 1 && rightEdge != tabList.constLast()->rect.right() + 1 - scrollOffset;
        if (tearLeftVisible && !tearLeftRect.isNull())
            leftEdge = tearLeftRect.right() + 1;
        if (tearRightVisible && !tearRightRect.isNull())
            rightEdge = tearRightRect.left();

        return QRect(leftEdge, 0, rightEdge - leftEdge, q->height());
    }
}